

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-array.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalArray<int>::SignalArray(SignalArray<int> *this,SignalBase<int> *sig)

{
  allocator_type local_1d;
  uint local_1c;
  
  local_1c = 0;
  SignalArray_const<int>::SignalArray_const(&this->super_SignalArray_const<int>,&local_1c);
  (this->super_SignalArray_const<int>)._vptr_SignalArray_const =
       (_func_int **)&PTR__SignalArray_00129c38;
  std::vector<dynamicgraph::SignalBase<int>_*,_std::allocator<dynamicgraph::SignalBase<int>_*>_>::
  vector(&this->array,0x14,&local_1d);
  (this->super_SignalArray_const<int>).size = 0x14;
  addElmt(this,sig);
  return;
}

Assistant:

SignalArray<Time>(SignalBase<Time> &sig)
      : SignalArray_const<Time>(0), array(DEFAULT_SIZE) {
    size = DEFAULT_SIZE;
    addElmt(&sig);
  }